

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

bool ctemplate::HasTemplateChangedOnDisk(char *resolved_filename,time_t mtime,FileStat *statbuf)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_49;
  string local_48 [32];
  FileStat *local_28;
  FileStat *statbuf_local;
  time_t mtime_local;
  char *resolved_filename_local;
  
  local_28 = statbuf;
  statbuf_local = (FileStat *)mtime;
  mtime_local = (time_t)resolved_filename;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,resolved_filename,&local_49);
  bVar1 = File::Stat((string *)local_48,local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if (((FileStat *)local_28->mtime == statbuf_local) && (0 < (long)statbuf_local)) {
      resolved_filename_local._7_1_ = false;
    }
    else {
      resolved_filename_local._7_1_ = true;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: ");
    poVar2 = std::operator<<(poVar2,"Unable to stat file ");
    poVar2 = std::operator<<(poVar2,(char *)mtime_local);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    resolved_filename_local._7_1_ = true;
  }
  return resolved_filename_local._7_1_;
}

Assistant:

bool HasTemplateChangedOnDisk(const char* resolved_filename,
                              time_t mtime,
                              FileStat* statbuf) {
  if (!File::Stat(resolved_filename, statbuf)) {
    LOG(WARNING) << "Unable to stat file " << resolved_filename << endl;
    // If we can't Stat the file then the file may have been deleted,
    // so reload the template.
    return true;
  }
  if (statbuf->mtime == mtime && mtime > 0) {
    // No need to reload yet.
    return false;
  }
  return true;
}